

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmExportTryCompileFileGenerator.cxx
# Opt level: O0

void __thiscall
cmExportTryCompileFileGenerator::PopulateProperties
          (cmExportTryCompileFileGenerator *this,cmGeneratorTarget *target,
          ImportPropertyMap *properties,
          set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
          *emitted)

{
  pointer *language;
  initializer_list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  init;
  cmValue propName;
  bool bVar1;
  string *psVar2;
  mapped_type *this_00;
  cmLocalGenerator *this_01;
  string_view sVar3;
  pair<std::_Rb_tree_const_iterator<const_cmGeneratorTarget_*>,_bool> pVar4;
  byte local_1f1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1d0;
  cmGeneratorTarget *local_160;
  cmGeneratorTarget *tgt;
  string *li;
  iterator __end3;
  iterator __begin3;
  cmList *__range3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_130;
  iterator local_110;
  size_type local_108;
  undefined1 local_100 [8];
  cmList depends;
  undefined1 local_c8 [8];
  string evalResult;
  cmValue local_78;
  cmValue v;
  string *p;
  iterator __end1;
  iterator __begin1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  undefined1 local_40 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  props;
  set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
  *emitted_local;
  ImportPropertyMap *properties_local;
  cmGeneratorTarget *target_local;
  cmExportTryCompileFileGenerator *this_local;
  
  props.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)emitted;
  cmGeneratorTarget::GetPropertyKeys_abi_cxx11_
            ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_40,target);
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<char_const(&)[25]>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_40,
             (char (*) [25])"INTERFACE_LINK_LIBRARIES");
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<char_const(&)[32]>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_40,
             (char (*) [32])"INTERFACE_LINK_LIBRARIES_DIRECT");
  std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
  emplace_back<char_const(&)[40]>
            ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)local_40,
             (char (*) [40])"INTERFACE_LINK_LIBRARIES_DIRECT_EXCLUDE");
  __end1 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_40);
  p = (string *)
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_40);
  do {
    bVar1 = __gnu_cxx::operator!=
                      (&__end1,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                *)&p);
    if (!bVar1) {
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_40);
      return;
    }
    v.Value = __gnu_cxx::
              __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator*(&__end1);
    local_78 = cmGeneratorTarget::GetProperty(target,v.Value);
    bVar1 = cmValue::operator_cast_to_bool(&local_78);
    if (bVar1) {
      psVar2 = cmValue::operator*[abi_cxx11_(&local_78);
      this_00 = std::
                map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator[](properties,v.Value);
      std::__cxx11::string::operator=((string *)this_00,(string *)psVar2);
      sVar3 = (string_view)
              std::__cxx11::string::operator_cast_to_basic_string_view((string *)v.Value);
      bVar1 = cmHasLiteralPrefix<34ul>(sVar3,(char (*) [34])"IMPORTED_LINK_INTERFACE_LIBRARIES");
      if (!bVar1) {
        sVar3 = (string_view)
                std::__cxx11::string::operator_cast_to_basic_string_view((string *)v.Value);
        bVar1 = cmHasLiteralPrefix<34ul>(sVar3,(char (*) [34])"IMPORTED_LINK_DEPENDENT_LIBRARIES");
        if (!bVar1) {
          sVar3 = (string_view)
                  std::__cxx11::string::operator_cast_to_basic_string_view((string *)v.Value);
          evalResult.field_2._8_8_ = sVar3._M_len;
          bVar1 = cmHasLiteralPrefix<25ul>(sVar3,(char (*) [25])"INTERFACE_LINK_LIBRARIES");
          if (!bVar1) goto LAB_00c88737;
        }
      }
      propName.Value = v.Value;
      language = &depends.Values.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage;
      std::__cxx11::string::string((string *)language);
      FindTargets((string *)local_c8,this,propName.Value,target,(string *)language,
                  (set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
                   *)props.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage);
      std::__cxx11::string::~string
                ((string *)
                 &depends.Values.
                  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  ._M_impl.super__Vector_impl_data._M_end_of_storage);
      std::__cxx11::string::string((string *)&local_130,(string *)local_c8);
      local_110 = &local_130;
      local_108 = 1;
      init._M_len = 1;
      init._M_array = local_110;
      cmList::cmList((cmList *)local_100,init);
      local_1d0 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&local_110;
      do {
        local_1d0 = local_1d0 + -1;
        std::__cxx11::string::~string((string *)local_1d0);
      } while (local_1d0 != &local_130);
      __end3 = cmList::begin_abi_cxx11_((cmList *)local_100);
      li = (string *)cmList::end_abi_cxx11_((cmList *)local_100);
      while (bVar1 = __gnu_cxx::operator!=
                               (&__end3,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                         *)&li), bVar1) {
        tgt = (cmGeneratorTarget *)
              __gnu_cxx::
              __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              ::operator*(&__end3);
        this_01 = cmGeneratorTarget::GetLocalGenerator(target);
        local_160 = cmLocalGenerator::FindGeneratorTargetToUse(this_01,(string *)tgt);
        local_1f1 = 0;
        if (local_160 != (cmGeneratorTarget *)0x0) {
          pVar4 = std::
                  set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
                  ::insert((set<const_cmGeneratorTarget_*,_std::less<const_cmGeneratorTarget_*>,_std::allocator<const_cmGeneratorTarget_*>_>
                            *)props.
                              super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_end_of_storage,&local_160);
          local_1f1 = pVar4.second;
        }
        if ((local_1f1 & 1) != 0) {
          std::vector<const_cmGeneratorTarget_*,_std::allocator<const_cmGeneratorTarget_*>_>::
          push_back(&this->Exports,&local_160);
        }
        __gnu_cxx::
        __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator++(&__end3);
      }
      cmList::~cmList((cmList *)local_100);
      std::__cxx11::string::~string((string *)local_c8);
    }
LAB_00c88737:
    __gnu_cxx::
    __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&__end1);
  } while( true );
}

Assistant:

void cmExportTryCompileFileGenerator::PopulateProperties(
  const cmGeneratorTarget* target, ImportPropertyMap& properties,
  std::set<cmGeneratorTarget const*>& emitted)
{
  // Look through all non-special properties.
  std::vector<std::string> props = target->GetPropertyKeys();
  // Include special properties that might be relevant here.
  props.emplace_back("INTERFACE_LINK_LIBRARIES");
  props.emplace_back("INTERFACE_LINK_LIBRARIES_DIRECT");
  props.emplace_back("INTERFACE_LINK_LIBRARIES_DIRECT_EXCLUDE");
  for (std::string const& p : props) {
    cmValue v = target->GetProperty(p);
    if (!v) {
      continue;
    }
    properties[p] = *v;

    if (cmHasLiteralPrefix(p, "IMPORTED_LINK_INTERFACE_LIBRARIES") ||
        cmHasLiteralPrefix(p, "IMPORTED_LINK_DEPENDENT_LIBRARIES") ||
        cmHasLiteralPrefix(p, "INTERFACE_LINK_LIBRARIES")) {
      std::string evalResult =
        this->FindTargets(p, target, std::string(), emitted);

      cmList depends{ evalResult };
      for (std::string const& li : depends) {
        cmGeneratorTarget* tgt =
          target->GetLocalGenerator()->FindGeneratorTargetToUse(li);
        if (tgt && emitted.insert(tgt).second) {
          this->Exports.push_back(tgt);
        }
      }
    }
  }
}